

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buf.c
# Opt level: O2

int xmlBufUpdateInput(xmlBufPtr buf,xmlParserInputPtr input,size_t pos)

{
  xmlChar *pxVar1;
  ulong uVar2;
  ulong uVar3;
  
  if (input == (xmlParserInputPtr)0x0 || buf == (xmlBufPtr)0x0) {
    return -1;
  }
  uVar2 = (ulong)buf->compat_size;
  if ((uVar2 < 0x7fffffff) && (buf->size != uVar2)) {
    buf->size = uVar2;
  }
  uVar3 = (ulong)buf->compat_use;
  uVar2 = buf->use;
  if (buf->use != uVar3 && uVar3 < 0x7fffffff) {
    buf->use = uVar3;
    uVar2 = uVar3;
  }
  pxVar1 = buf->content;
  input->base = pxVar1;
  input->cur = pxVar1 + pos;
  input->end = pxVar1 + uVar2;
  return 0;
}

Assistant:

int
xmlBufUpdateInput(xmlBufPtr buf, xmlParserInputPtr input, size_t pos) {
    if ((buf == NULL) || (input == NULL))
        return(-1);
    CHECK_COMPAT(buf)
    input->base = buf->content;
    input->cur = input->base + pos;
    input->end = &buf->content[buf->use];
    return(0);
}